

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.h
# Opt level: O0

void __thiscall
TTD::UnorderedArrayList<int,_32UL>::AddArrayLink(UnorderedArrayList<int,_32UL> *this)

{
  UnorderedArrayListLink *pUVar1;
  int *piVar2;
  int *newBlockData;
  UnorderedArrayListLink *copiedOldBlock;
  UnorderedArrayList<int,_32UL> *this_local;
  
  pUVar1 = SlabAllocatorBase<0>::
           SlabAllocateStruct<TTD::UnorderedArrayList<int,32ul>::UnorderedArrayListLink>
                     (this->m_alloc);
  pUVar1->CurrPos = (this->m_inlineHeadBlock).CurrPos;
  pUVar1->EndPos = (this->m_inlineHeadBlock).EndPos;
  pUVar1->BlockData = (this->m_inlineHeadBlock).BlockData;
  pUVar1->Next = (this->m_inlineHeadBlock).Next;
  piVar2 = SlabAllocatorBase<0>::SlabAllocateFixedSizeArray<int,32ul>(this->m_alloc);
  (this->m_inlineHeadBlock).BlockData = piVar2;
  (this->m_inlineHeadBlock).CurrPos = piVar2;
  (this->m_inlineHeadBlock).EndPos = piVar2 + 0x20;
  (this->m_inlineHeadBlock).Next = pUVar1;
  return;
}

Assistant:

void AddArrayLink()
        {
            UnorderedArrayListLink* copiedOldBlock = this->m_alloc->template SlabAllocateStruct<UnorderedArrayListLink>();
            *copiedOldBlock = this->m_inlineHeadBlock;

            T* newBlockData = this->m_alloc->template SlabAllocateFixedSizeArray<T, allocSize>();

            this->m_inlineHeadBlock.BlockData = newBlockData;
            this->m_inlineHeadBlock.CurrPos = newBlockData;
            this->m_inlineHeadBlock.EndPos = newBlockData + allocSize;

            this->m_inlineHeadBlock.Next = copiedOldBlock;
        }